

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.h
# Opt level: O3

void trieste::logging::append<std::basic_string_view<char,std::char_traits<char>>>
               (Log *self,basic_string_view<char,_std::char_traits<char>_> *t)

{
  runtime_error *this;
  
  if (self->print != Silent) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)((self->strstream).data + 0x10),t->_M_str,t->_M_len);
    return;
  }
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this,"Log should not be printed! Use should_print()");
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

bool is_active()
    {
      return print != Status::Silent;
    }